

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_variables.cpp
# Opt level: O3

void duckdb::DuckDBVariablesFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  idx_t iVar1;
  GlobalTableFunctionState *pGVar2;
  pointer pcVar3;
  reference pvVar4;
  _func_int **__n;
  ulong index;
  bool bVar5;
  string local_d0;
  string local_b0;
  string local_90;
  Value local_70;
  
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::CheckValid(&data_p->global_state);
  pGVar2 = (data_p->global_state).ptr;
  __n = pGVar2[4]._vptr_GlobalTableFunctionState;
  if (__n < (_func_int **)
            (((long)pGVar2[2]._vptr_GlobalTableFunctionState -
              (long)pGVar2[1]._vptr_GlobalTableFunctionState >> 5) * -0x5555555555555555)) {
    index = 0;
    do {
      pGVar2[4]._vptr_GlobalTableFunctionState = (_func_int **)((long)__n + 1);
      pvVar4 = vector<duckdb::VariableData,_true>::operator[]
                         ((vector<duckdb::VariableData,_true> *)(pGVar2 + 1),(size_type)__n);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      pcVar3 = (pvVar4->name)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,pcVar3,pcVar3 + (pvVar4->name)._M_string_length);
      Value::Value(&local_70,&local_d0);
      DataChunk::SetValue(output,0,index,&local_70);
      Value::~Value(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      Value::ToString_abi_cxx11_(&local_90,&pvVar4->value);
      Value::Value(&local_70,&local_90);
      DataChunk::SetValue(output,1,index,&local_70);
      Value::~Value(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      LogicalType::ToString_abi_cxx11_(&local_b0,&(pvVar4->value).type_);
      Value::Value(&local_70,&local_b0);
      DataChunk::SetValue(output,2,index,&local_70);
      Value::~Value(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      iVar1 = index + 1;
      __n = pGVar2[4]._vptr_GlobalTableFunctionState;
    } while ((__n < (_func_int **)
                    (((long)pGVar2[2]._vptr_GlobalTableFunctionState -
                      (long)pGVar2[1]._vptr_GlobalTableFunctionState >> 5) * -0x5555555555555555))
            && (bVar5 = index < 0x7ff, index = iVar1, bVar5));
    output->count = iVar1;
  }
  return;
}

Assistant:

void DuckDBVariablesFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<DuckDBVariablesData>();
	if (data.offset >= data.variables.size()) {
		// finished returning values
		return;
	}
	// start returning values
	// either fill up the chunk or return all the remaining columns
	idx_t count = 0;
	while (data.offset < data.variables.size() && count < STANDARD_VECTOR_SIZE) {
		auto &variable_entry = data.variables[data.offset++];

		// return values:
		idx_t col = 0;
		// name, VARCHAR
		output.SetValue(col++, count, Value(variable_entry.name));
		// value, BIGINT
		output.SetValue(col++, count, Value(variable_entry.value.ToString()));
		// type, VARCHAR
		output.SetValue(col, count, Value(variable_entry.value.type().ToString()));
		count++;
	}
	output.SetCardinality(count);
}